

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O0

void test_bson_writer_null_realloc_2(void)

{
  byte bVar1;
  int iVar2;
  int local_50;
  int i;
  int r;
  bson_t *b;
  size_t buflen;
  uint8_t *buf;
  bson_writer_t *writer;
  uint8_t testdata [32];
  
  writer = (bson_writer_t *)0x50000000005;
  testdata[0] = '\0';
  testdata[1] = '\0';
  testdata[2] = '\x05';
  testdata[3] = '\0';
  testdata[4] = '\0';
  testdata[5] = '\0';
  testdata[6] = '\0';
  testdata[7] = '\x05';
  testdata[8] = '\0';
  testdata[9] = '\0';
  testdata[10] = '\0';
  testdata[0xb] = '\0';
  testdata[0xc] = '\x05';
  testdata[0xd] = '\0';
  testdata[0xe] = '\0';
  testdata[0xf] = '\0';
  testdata[0x10] = '\0';
  testdata[0x11] = '\x05';
  testdata[0x12] = '\0';
  testdata[0x13] = '\0';
  testdata[0x14] = '\0';
  testdata[0x15] = '\0';
  testdata[0x16] = '\0';
  testdata[0x17] = '\0';
  buflen = bson_malloc0(0x20);
  b = (bson_t *)0x20;
  buf = (uint8_t *)bson_writer_new(&buflen,&b,0,0);
  for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
    bVar1 = bson_writer_begin(buf,&i);
    if ((bVar1 & 1) == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
              ,0xaa,"test_bson_writer_null_realloc_2","bson_writer_begin (writer, &b)");
      abort();
    }
    bson_writer_end(buf);
  }
  bVar1 = bson_writer_begin(buf,&i);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
            ,0xae,"test_bson_writer_null_realloc_2","bson_writer_begin (writer, &b)");
    abort();
  }
  bVar1 = bson_append_int32(_i,"a",0xffffffff,0x7b);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
            ,0xaf,"test_bson_writer_null_realloc_2","!bson_append_int32 (b, \"a\", -1, 123)");
    abort();
  }
  bson_writer_end(buf);
  iVar2 = memcmp((void *)buflen,&writer,0x20);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
            ,0xb3,"test_bson_writer_null_realloc_2","r == 0");
    abort();
  }
  bson_writer_destroy(buf);
  bson_free(buflen);
  return;
}

Assistant:

static void
test_bson_writer_null_realloc_2 (void)
{
   const uint8_t testdata[] = {5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5,
                               0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 0, 0};
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc0 (32);
   size_t buflen = 32;
   bson_t *b;
   int r;
   int i;

   writer = bson_writer_new (&buf, &buflen, 0, NULL, NULL);
   for (i = 0; i < 5; i++) {
      BSON_ASSERT (bson_writer_begin (writer, &b));
      bson_writer_end (writer);
   }

   BSON_ASSERT (bson_writer_begin (writer, &b));
   BSON_ASSERT (!bson_append_int32 (b, "a", -1, 123));
   bson_writer_end (writer);

   r = memcmp (buf, testdata, 32);
   BSON_ASSERT (r == 0);
   bson_writer_destroy (writer);

   bson_free (buf);
}